

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSources::DeleteOwnSSRC(RTPSources *this)

{
  RTPInternalSourceData *obj;
  bool bVar1;
  RTPMemoryManager *mgr;
  uint32_t local_1c;
  RTPSources *pRStack_18;
  uint32_t ssrc;
  RTPSources *this_local;
  
  if (this->owndata == (RTPInternalSourceData *)0x0) {
    this_local._4_4_ = -0x42;
  }
  else {
    pRStack_18 = this;
    local_1c = RTPSourceData::GetSSRC(&this->owndata->super_RTPSourceData);
    RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
    ::GotoElement(&this->sourcelist,&local_1c);
    RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
    ::DeleteCurrentElement(&this->sourcelist);
    this->totalcount = this->totalcount + -1;
    bVar1 = RTPSourceData::IsSender(&this->owndata->super_RTPSourceData);
    if (bVar1) {
      this->sendercount = this->sendercount + -1;
    }
    bVar1 = RTPSourceData::IsActive(&this->owndata->super_RTPSourceData);
    if (bVar1) {
      this->activecount = this->activecount + -1;
    }
    (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,this->owndata);
    obj = this->owndata;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPInternalSourceData>(obj,mgr);
    this->owndata = (RTPInternalSourceData *)0x0;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPSources::DeleteOwnSSRC()
{
	if (owndata == 0)
		return ERR_RTP_SOURCES_DONTHAVEOWNSSRC;

	uint32_t ssrc = owndata->GetSSRC();

	sourcelist.GotoElement(ssrc);
	sourcelist.DeleteCurrentElement();

	totalcount--;
	if (owndata->IsSender())
		sendercount--;
	if (owndata->IsActive())
		activecount--;

	OnRemoveSource(owndata);
	
	RTPDelete(owndata,GetMemoryManager());
	owndata = 0;
	return 0;
}